

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::OpenIt(QL_NodeRel *this,void *data)

{
  RC rc;
  void *data_local;
  QL_NodeRel *this_local;
  
  (this->super_QL_Node).isOpen = true;
  this->value = data;
  this_local._4_4_ =
       IX_Manager::OpenIndex(((this->super_QL_Node).qlm)->ixm,this->relName,this->indexNo,&this->ih)
  ;
  if (((this_local._4_4_ == 0) &&
      (this_local._4_4_ = IX_IndexScan::OpenScan(&this->is,&this->ih,EQ_OP,this->value,NO_HINT),
      this_local._4_4_ == 0)) &&
     (this_local._4_4_ =
           RM_Manager::OpenFile(((this->super_QL_Node).qlm)->rmm,this->relName,&this->fh),
     this_local._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_NodeRel::OpenIt(void *data){
  RC rc = 0;
  isOpen = true;
  value = data;
  if((rc = qlm.ixm.OpenIndex(relName, indexNo, ih)))
    return (rc);
  if((rc = is.OpenScan(ih, EQ_OP, value)))
    return (rc);
  if((rc = qlm.rmm.OpenFile(relName, fh)))
    return (rc);
  return (0);
}